

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  long in_RDI;
  ImGuiTableColumn *column_1;
  int column_n_1;
  ImGuiTableColumn *column;
  int column_n;
  float visible_width;
  float visible_weight;
  int local_24;
  int local_14;
  float local_10;
  float local_c;
  
  local_c = 0.0;
  local_10 = 0.0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x6c); local_14 = local_14 + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_14);
    if (((pIVar1->IsEnabled & 1U) != 0) && ((pIVar1->Flags & 4U) != 0)) {
      local_c = pIVar1->StretchWeight + local_c;
      local_10 = pIVar1->WidthRequest + local_10;
    }
  }
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x6c); local_24 = local_24 + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_24);
    if (((pIVar1->IsEnabled & 1U) != 0) && ((pIVar1->Flags & 4U) != 0)) {
      pIVar1->StretchWeight = (pIVar1->WidthRequest / local_10) * local_c;
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}